

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string_view value,Arena *arena)

{
  void *pvVar1;
  Nonnull<const_char_*> failure_msg;
  string *unaff_RBX;
  TaggedStringPtr TVar2;
  ulong uVar3;
  LogMessageFatal *v1;
  string_view s;
  LogMessageFatal LStack_38;
  
  s._M_len = value._M_str;
  v1 = &LStack_38;
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) == 0) {
    if (arena != (Arena *)0x0) {
      s._M_str = (char *)arena;
      TVar2 = anon_unknown_8::CreateArenaString((anon_unknown_8 *)arena,(Arena *)value._M_len,s);
      goto LAB_002ee0b5;
    }
    unaff_RBX = (string *)operator_new(0x20);
    *(string **)unaff_RBX = unaff_RBX + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (unaff_RBX,s._M_len,s._M_len + (long)&((Arena *)value._M_len)->impl_);
    v1 = (LogMessageFatal *)((ulong)unaff_RBX & 3);
    if (v1 != (LogMessageFatal *)0x0) goto LAB_002ee0d6;
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    if (((ulong)pvVar1 & 2) == 0) {
      Set((ArenaStringPtr *)&LStack_38);
    }
    else {
      uVar3 = (ulong)pvVar1 & 0xfffffffffffffffc;
      if (uVar3 != 0) {
        std::__cxx11::string::_M_replace(uVar3,0,*(char **)(uVar3 + 8),(ulong)s._M_len);
        return;
      }
    }
    Set((ArenaStringPtr *)&LStack_38);
LAB_002ee0d6:
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                            ((unsigned_long)v1,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
  }
  if (failure_msg != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
               ,0xba,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
  }
  TVar2.ptr_ = (void *)((ulong)unaff_RBX | 2);
LAB_002ee0b5:
  (this->tagged_ptr_).ptr_ = TVar2.ptr_;
  return;
}

Assistant:

void ArenaStringPtr::Set(absl::string_view value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value.data(), value.length());
    }
  }
}